

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall
re2::ProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,Workq *q)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Inst *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar4;
  uint *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string local_50;
  
  paVar6 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2._0_1_ = prog->anchor_start_;
  iVar2._1_1_ = prog->anchor_end_;
  iVar2._2_1_ = prog->reversed_;
  iVar2._3_1_ = prog->did_flatten_;
  if (iVar2 != 0) {
    puVar5 = *(uint **)&prog->size_;
    do {
      uVar4 = *puVar5;
      this_00 = (Inst *)((long)(int)uVar4 * 8 + *(long *)(this + 0x48));
      Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
      StringAppendF(__return_storage_ptr__,"%d. %s\n",(ulong)uVar4,local_50._M_dataplus._M_p,in_R8,
                    in_R9,paVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (0xf < this_00->out_opcode_) {
        uVar4 = this_00->out_opcode_ >> 4;
        bVar3 = SparseSet::contains((SparseSet *)prog,uVar4);
        if (!bVar3) {
          SparseSet::insert_new((SparseSet *)prog,uVar4);
        }
      }
      if ((((this_00->out_opcode_ & 6) == 0) && (iVar2 = (this_00->field_1).cap_, iVar2 != 0)) &&
         (bVar3 = SparseSet::contains((SparseSet *)prog,iVar2), !bVar3)) {
        SparseSet::insert_new((SparseSet *)prog,iVar2);
      }
      puVar5 = puVar5 + 1;
      iVar1._0_1_ = prog->anchor_start_;
      iVar1._1_1_ = prog->anchor_end_;
      iVar1._2_1_ = prog->reversed_;
      iVar1._3_1_ = prog->did_flatten_;
    } while (puVar5 != (uint *)((long)iVar1 * 4 + *(long *)&prog->size_));
  }
  return __return_storage_ptr__;
}

Assistant:

static string ProgToString(Prog* prog, Workq* q) {
  string s;
  for (Workq::iterator i = q->begin(); i != q->end(); ++i) {
    int id = *i;
    Prog::Inst* ip = prog->inst(id);
    StringAppendF(&s, "%d. %s\n", id, ip->Dump().c_str());
    AddToQueue(q, ip->out());
    if (ip->opcode() == kInstAlt || ip->opcode() == kInstAltMatch)
      AddToQueue(q, ip->out1());
  }
  return s;
}